

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,LengthExpression *expression)

{
  pointer pcVar1;
  int iVar2;
  Value *pVVar3;
  ArrayValue *this_00;
  VariableValue *this_01;
  PrimitiveSimpleObject *this_02;
  Type *this_03;
  string local_90;
  string local_70;
  Symbol local_50;
  
  pcVar1 = (expression->variable_name_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (expression->variable_name_)._M_string_length);
  Symbol::Symbol(&local_50,&local_70);
  iVar2 = FunctionTable::Get(&this->table_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name_._M_dataplus._M_p != &local_50.name_.field_2) {
    operator_delete(local_50.name_._M_dataplus._M_p,local_50.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pVVar3 = FrameEmulator::Get(&this->frame_,iVar2);
  this_00 = (ArrayValue *)__dynamic_cast(pVVar3,&Value::typeinfo,&ArrayValue::typeinfo,0);
  iVar2 = ArrayValue::GetSize(this_00);
  this_01 = (VariableValue *)operator_new(0x50);
  this_02 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_03 = (Type *)operator_new(0x28);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"int","");
  Type::Type(this_03,&local_90);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_02,this_03);
  VariableValue::VariableValue(this_01,this_02,iVar2);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(LengthExpression* expression) {
  int index = table_.Get(Symbol(expression->variable_name_));
  int size = dynamic_cast<ArrayValue*>(frame_.Get(index))->GetSize();
  tos_value_ =
      new VariableValue(new PrimitiveSimpleObject(new Type("int")), size);
}